

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

void __thiscall
ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints
          (ON_OBSOLETE_V5_DimOrdinate *this,ON_2dPoint p0,ON_2dPoint p1,int direction,
          double default_offset,ON_2dPoint *k0,ON_2dPoint *k1)

{
  double dVar1;
  double *pdVar2;
  double local_60;
  double offset1;
  double offset0;
  ON_2dPoint *k1_local;
  ON_2dPoint *k0_local;
  double default_offset_local;
  int direction_local;
  ON_OBSOLETE_V5_DimOrdinate *this_local;
  ON_2dPoint p1_local;
  ON_2dPoint p0_local;
  
  p1_local.x = p1.y;
  this_local = (ON_OBSOLETE_V5_DimOrdinate *)p1.x;
  p1_local.y = p0.x;
  offset1 = KinkOffset(this,0);
  local_60 = KinkOffset(this,1);
  if ((offset1 == -1.23432101234321e+308) && (!NAN(offset1))) {
    offset1 = default_offset;
  }
  if ((local_60 == -1.23432101234321e+308) && (!NAN(local_60))) {
    local_60 = default_offset;
  }
  pdVar2 = ON_2dPoint::operator[]((ON_2dPoint *)&p1_local.y,1 - direction);
  dVar1 = *pdVar2;
  pdVar2 = ON_2dPoint::operator[]((ON_2dPoint *)&this_local,1 - direction);
  if (*pdVar2 <= dVar1 && dVar1 != *pdVar2) {
    offset1 = -offset1;
    local_60 = -local_60;
  }
  if (direction == 0) {
    k1->x = p1_local.y;
    k1->y = (p1_local.x - offset1) - local_60;
    k0->x = (double)this_local;
    k0->y = p1_local.x - offset1;
  }
  else {
    k1->x = ((double)this_local - offset1) - local_60;
    k1->y = p0.y;
    k0->x = (double)this_local - offset1;
    k0->y = p1_local.x;
  }
  return;
}

Assistant:

void ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints( ON_2dPoint p0, ON_2dPoint p1, 
                                            int direction, double default_offset,
                                            ON_2dPoint& k0, ON_2dPoint& k1) const
{
  double offset0 = KinkOffset( 0);
  double offset1 = KinkOffset( 1);

  // if these haven't been set by dragging the offset points
  // use 2*textheight
  if( offset0 == ON_UNSET_VALUE)
    offset0 = default_offset;
  if( offset1 == ON_UNSET_VALUE)
    offset1 = default_offset;

  if( p0[1-direction] > p1[1-direction])
  {
    offset0 = -offset0;
    offset1 = -offset1;
  }

  //double d = fabs( p0[1-direction] - p1[1-direction]);

  if( direction == 0)
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p0.x;
      k1.y = p1.y - offset0 - offset1;
    //}
    //else
    //{
    //  k1.x = p0.x;
    //  k1.y = p1.y + offset0 - offset1;
    //}

    k0.x = p1.x;
    k0.y = p1.y - offset0;
  }
  else
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p1.x - offset0 - offset1;
      k1.y = p0.y;
    //}
    //else
    //{
    //  k1.x = p1.x + offset0 - offset1;
    //  k1.y = p0.y;
    //}

    k0.x = p1.x - offset0;
    k0.y = p1.y;
  }
}